

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void EnsureTrailingSlash(string *path)

{
  ulong uVar1;
  char *pcVar2;
  value_type last;
  string *path_local;
  
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) && (pcVar2 = (char *)std::__cxx11::string::back(), *pcVar2 != '/')) {
    std::__cxx11::string::operator+=((string *)path,'/');
  }
  return;
}

Assistant:

static void EnsureTrailingSlash(std::string& path)
{
  if (path.empty()) {
    return;
  }
  std::string::value_type last = path.back();
#ifdef _WIN32
  if (last != '\\') {
    path += '\\';
  }
#else
  if (last != '/') {
    path += '/';
  }
#endif
}